

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O2

int WebRtcIsac_EncodeSpec
              (int16_t *fr,int16_t *fi,int16_t AvgPitchGain_Q12,ISACBand band,Bitstr *streamdata)

{
  undefined8 uVar1;
  uint den;
  int iVar2;
  undefined1 auVar3 [14];
  char cVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  ushort uVar12;
  int iVar13;
  ulong uVar14;
  int *piVar15;
  int16_t (*paiVar16) [60];
  long lVar17;
  undefined6 in_register_00000012;
  long lVar18;
  int16_t *piVar19;
  int iVar20;
  uint uVar21;
  int32_t *piVar22;
  int iVar23;
  long lVar24;
  int32_t *R;
  bool bVar25;
  bool bVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined4 uVar31;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int local_cd0;
  int16_t ARCoefQ12 [7];
  int32_t gain2_Q10;
  int32_t CorrQ7 [7];
  int32_t CorrQ7_norm [7];
  int16_t RCQ15 [6];
  uint16_t invARSpecQ8 [120];
  int32_t PSpec [120];
  int32_t invARSpec2_Q16 [120];
  int16_t ditherQ7 [480];
  int16_t dataQ7 [480];
  ulong uVar32;
  
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(ditherQ7,streamdata->W_upper,(int)AvgPitchGain_Q12,0);
    for (uVar14 = 0; uVar14 < 0x1e0; uVar14 = uVar14 + 4) {
      uVar1 = *(undefined8 *)(ditherQ7 + uVar14);
      sVar27 = (short)((ulong)uVar1 >> 0x10);
      sVar28 = (short)((ulong)uVar1 >> 0x20);
      sVar29 = (short)((ulong)uVar1 >> 0x30);
      auVar34._0_2_ =
           ((short)*(undefined4 *)((long)fr + uVar14) + (short)uVar1 + L'@' & 0xff80U) -
           (short)uVar1;
      sVar27 = ((short)*(undefined4 *)((long)fi + uVar14) + sVar27 + L'@' & 0xff80U) - sVar27;
      uVar31 = CONCAT22(sVar27,auVar34._0_2_);
      sVar28 = ((short)((uint)*(undefined4 *)((long)fr + uVar14) >> 0x10) + sVar28 + L'@' & 0xff80U)
               - sVar28;
      sVar29 = ((short)((uint)*(undefined4 *)((long)fi + uVar14) >> 0x10) + sVar29 + L'@' & 0xff80U)
               - sVar29;
      uVar32 = CONCAT26(sVar29,CONCAT24(sVar28,uVar31));
      *(ulong *)(dataQ7 + uVar14) = uVar32;
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar32;
      auVar3._12_2_ = sVar29;
      auVar6._8_2_ = sVar28;
      auVar6._0_8_ = uVar32;
      auVar6._10_4_ = auVar3._10_4_;
      auVar10._6_8_ = 0;
      auVar10._0_6_ = auVar6._8_6_;
      auVar8._4_2_ = sVar27;
      auVar8._0_4_ = uVar31;
      auVar8._6_8_ = SUB148(auVar10 << 0x40,6);
      auVar34._2_2_ = 0;
      auVar34._4_10_ = auVar8._4_10_;
      auVar34._14_2_ = 0;
      auVar34 = pmaddwd(auVar34,auVar34);
      *(uint *)((long)PSpec + uVar14) =
           (uint)(auVar34._12_4_ + auVar34._4_4_ + auVar34._8_4_ + auVar34._0_4_) >> 2;
    }
    local_cd0 = 0x1e0;
    bVar25 = false;
  }
  else {
    GenerateDitherQ7LbUB
              (ditherQ7,streamdata->W_upper,(int)CONCAT62(in_register_00000012,AvgPitchGain_Q12));
    bVar25 = band == kIsacUpperBand12;
    local_cd0 = 0x1e0;
    if (bVar25) {
      local_cd0 = 0xf0;
    }
    if (band == kIsacUpperBand16) {
      lVar17 = 0x1de;
      for (lVar18 = 0; lVar18 != 0xf0; lVar18 = lVar18 + 2) {
        uVar1 = *(undefined8 *)(ditherQ7 + lVar18 * 2);
        sVar27 = (short)((ulong)uVar1 >> 0x10);
        sVar28 = (short)((ulong)uVar1 >> 0x20);
        sVar29 = (short)((ulong)uVar1 >> 0x30);
        auVar33._0_2_ =
             (*(short *)((long)fr + lVar18) + (short)uVar1 + L'@' & 0xff80U) - (short)uVar1;
        sVar27 = (*(short *)((long)fi + lVar18) + sVar27 + L'@' & 0xff80U) - sVar27;
        uVar31 = CONCAT22(sVar27,auVar33._0_2_);
        sVar28 = (*(short *)((long)fr + lVar17) + sVar28 + L'@' & 0xff80U) - sVar28;
        sVar29 = (*(short *)((long)fi + lVar17) + sVar29 + L'@' & 0xff80U) - sVar29;
        uVar14 = CONCAT26(sVar29,CONCAT24(sVar28,uVar31));
        *(ulong *)(dataQ7 + lVar18 * 2) = uVar14;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar14;
        auVar5._12_2_ = sVar29;
        auVar7._8_2_ = sVar28;
        auVar7._0_8_ = uVar14;
        auVar7._10_4_ = auVar5._10_4_;
        auVar11._6_8_ = 0;
        auVar11._0_6_ = auVar7._8_6_;
        auVar9._4_2_ = sVar27;
        auVar9._0_4_ = uVar31;
        auVar9._6_8_ = SUB148(auVar11 << 0x40,6);
        auVar33._2_2_ = 0;
        auVar33._4_10_ = auVar9._4_10_;
        auVar33._14_2_ = 0;
        auVar34 = pmaddwd(auVar33,auVar33);
        *(uint *)((long)PSpec + lVar18 * 2) =
             (uint)(auVar34._12_4_ + auVar34._4_4_ + auVar34._8_4_ + auVar34._0_4_) >> 2;
        lVar17 = lVar17 + -2;
      }
    }
    else if (band == kIsacUpperBand12) {
      for (uVar14 = 0; uVar14 < 0xf0; uVar14 = uVar14 + 4) {
        uVar1 = *(undefined8 *)(ditherQ7 + uVar14);
        sVar28 = (short)((ulong)uVar1 >> 0x10);
        sVar29 = (short)((ulong)uVar1 >> 0x20);
        sVar30 = (short)((ulong)uVar1 >> 0x30);
        sVar27 = ((short)*(undefined4 *)((long)fr + uVar14) + (short)uVar1 + L'@' & 0xff80U) -
                 (short)uVar1;
        sVar28 = ((short)*(undefined4 *)((long)fi + uVar14) + sVar28 + L'@' & 0xff80U) - sVar28;
        sVar29 = ((short)((uint)*(undefined4 *)((long)fr + uVar14) >> 0x10) + sVar29 + L'@' &
                 0xff80U) - sVar29;
        sVar30 = ((short)((uint)*(undefined4 *)((long)fi + uVar14) >> 0x10) + sVar30 + L'@' &
                 0xff80U) - sVar30;
        *(uint *)((long)PSpec + uVar14 * 2) =
             (uint)((int)sVar28 * (int)sVar28 + (int)sVar27 * (int)sVar27) >> 1;
        *(ulong *)(dataQ7 + uVar14) = CONCAT26(sVar30,CONCAT24(sVar29,CONCAT22(sVar28,sVar27)));
        *(uint *)((long)PSpec + uVar14 * 2 + 4) =
             (uint)((int)sVar30 * (int)sVar30 + (int)sVar29 * (int)sVar29) >> 1;
      }
    }
  }
  piVar15 = PSpec + 0x77;
  for (lVar17 = 0; lVar17 != 0x3c; lVar17 = lVar17 + 1) {
    iVar20 = *piVar15;
    invARSpec2_Q16[lVar17] = PSpec[lVar17] + iVar20 + 0x10 >> 5;
    PSpec[lVar17 + -0x3c] = (PSpec[lVar17] + 0x10) - iVar20 >> 5;
    piVar15 = piVar15 + -1;
  }
  CorrQ7[0] = 2;
  for (lVar17 = 0; lVar17 != 0x3c; lVar17 = lVar17 + 1) {
    CorrQ7[0] = CorrQ7[0] + invARSpec2_Q16[lVar17];
  }
  paiVar16 = WebRtcIsac_kCos;
  for (uVar14 = 0; uVar14 < 6; uVar14 = uVar14 + 2) {
    iVar20 = 0;
    for (lVar17 = 0; lVar17 != 0x3c; lVar17 = lVar17 + 1) {
      iVar20 = iVar20 + ((int)(*paiVar16)[lVar17] * PSpec[lVar17 + -0x3c] + 0x100 >> 9);
    }
    CorrQ7[uVar14 + 1] = iVar20;
    paiVar16 = paiVar16 + 2;
  }
  lVar17 = 0x1a5ab8;
  for (uVar14 = 1; uVar14 < 6; uVar14 = uVar14 + 2) {
    iVar20 = 0;
    for (lVar18 = 0; lVar18 != 0x3c; lVar18 = lVar18 + 1) {
      iVar20 = iVar20 + ((int)*(short *)(lVar17 + lVar18 * 2) * invARSpec2_Q16[lVar18] + 0x100 >> 9)
      ;
    }
    CorrQ7[uVar14 + 1] = iVar20;
    lVar17 = lVar17 + 0xf0;
  }
  uVar12 = WebRtcSpl_NormW32(CorrQ7[0]);
  cVar4 = (char)uVar12;
  if (uVar12 < 0x13) {
    for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
      CorrQ7_norm[lVar17] = CorrQ7[lVar17] >> (0x12U - cVar4 & 0x1f);
    }
  }
  else {
    for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
      CorrQ7_norm[lVar17] = CorrQ7[lVar17] << (cVar4 - 0x12U & 0x1f);
    }
  }
  R = CorrQ7_norm;
  WebRtcSpl_AutoCorrToReflCoef(R,6,RCQ15);
  WebRtcIsac_EncodeRc(RCQ15,streamdata);
  WebRtcSpl_ReflCoefToLpc(RCQ15,6,ARCoefQ12);
  lVar17 = 1;
  piVar19 = ARCoefQ12;
  uVar21 = 0;
  for (lVar18 = 0; piVar19 = piVar19 + 1, lVar18 != 7; lVar18 = lVar18 + 1) {
    piVar22 = R;
    for (lVar24 = 0; lVar17 != lVar24; lVar24 = lVar24 + 1) {
      uVar21 = uVar21 + (((int)ARCoefQ12[lVar24] * *piVar22 + 0x100 >> 9) * (int)ARCoefQ12[lVar18] +
                         4 >> 3);
      piVar22 = piVar22 + -1;
    }
    for (lVar24 = 0; lVar18 + lVar24 != 6; lVar24 = lVar24 + 1) {
      uVar21 = uVar21 + (((int)piVar19[lVar24] * CorrQ7_norm[lVar24 + 1] + 0x100 >> 9) *
                         (int)ARCoefQ12[lVar18] + 4 >> 3);
    }
    lVar17 = lVar17 + 1;
    R = R + 1;
  }
  den = uVar21 << (0x12U - cVar4 & 0x1f);
  if (0x12 < uVar12) {
    den = uVar21 >> (cVar4 - 0x12U & 0x1f);
  }
  if (0x7ffffffe < den) {
    den = 0x7fffffff;
  }
  gain2_Q10 = WebRtcSpl_DivResultInQ31(0x78,den);
  WebRtcIsac_EncodeGain2(&gain2_Q10,streamdata);
  FindInvArSpec(ARCoefQ12,gain2_Q10,invARSpec2_Q16);
  uVar12 = WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]);
  iVar20 = 1 << ((byte)(uVar12 >> 1) & 0x1f);
  lVar17 = 0;
  do {
    if (lVar17 == 0x78) {
      iVar20 = WebRtcIsac_EncLogisticMulti2(streamdata,dataQ7,invARSpecQ8,local_cd0,(ushort)bVar25);
      return (int)(short)iVar20 >> 0x1f & (int)(short)iVar20;
    }
    iVar13 = invARSpec2_Q16[lVar17];
    iVar2 = -iVar13;
    if (0 < iVar13) {
      iVar2 = iVar13;
    }
    iVar13 = iVar2 / iVar20 + iVar20 >> 1;
    iVar23 = -10;
    do {
      iVar20 = iVar13;
      iVar13 = iVar2 / iVar20 + iVar20 >> 1;
      if (iVar13 == iVar20) break;
      bVar26 = iVar23 != 0;
      iVar23 = iVar23 + 1;
    } while (bVar26);
    invARSpecQ8[lVar17] = (uint16_t)iVar13;
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

int WebRtcIsac_EncodeSpec(const int16_t* fr, const int16_t* fi,
                          int16_t AvgPitchGain_Q12, enum ISACBand band,
                          Bitstr* streamdata) {
  int16_t ditherQ7[FRAMESAMPLES];
  int16_t dataQ7[FRAMESAMPLES];
  int32_t PSpec[FRAMESAMPLES_QUARTER];
  int32_t invARSpec2_Q16[FRAMESAMPLES_QUARTER];
  uint16_t invARSpecQ8[FRAMESAMPLES_QUARTER];
  int32_t CorrQ7[AR_ORDER + 1];
  int32_t CorrQ7_norm[AR_ORDER + 1];
  int16_t RCQ15[AR_ORDER];
  int16_t ARCoefQ12[AR_ORDER + 1];
  int32_t gain2_Q10;
  int16_t val;
  int32_t nrg, res;
  uint32_t sum;
  int32_t in_sqrt;
  int32_t newRes;
  int16_t err;
  uint32_t nrg_u32;
  int shift_var;
  int k, n, j, i;
  int is_12khz = !kIsSWB12;
  int num_dft_coeff = FRAMESAMPLES;

  /* Create dither signal. */
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(ditherQ7, streamdata->W_upper, FRAMESAMPLES,
                       AvgPitchGain_Q12);
  } else {
    GenerateDitherQ7LbUB(ditherQ7, streamdata->W_upper, FRAMESAMPLES);
    if (band == kIsacUpperBand12) {
      is_12khz = kIsSWB12;
      num_dft_coeff = FRAMESAMPLES_HALF;
    }
  }

  /* add dither and quantize, and compute power spectrum */
  switch (band) {
    case kIsacLowerBand: {
      for (k = 0; k < FRAMESAMPLES; k += 4) {
        val = ((*fr++ + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        val = ((*fr++ + ditherQ7[k + 2] + 64) & 0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum += val * val;

        val = ((*fi++ + ditherQ7[k + 3] + 64) & 0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[k >> 2] = sum >> 2;
      }
      break;
    }
    case kIsacUpperBand12: {
      for (k = 0, j = 0; k < FRAMESAMPLES_HALF; k += 4) {
        val = ((*fr++ + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        PSpec[j++] = sum >> 1;

        val = ((*fr++ + ditherQ7[k + 2] + 64) & 0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 3] + 64) & 0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[j++] = sum >> 1;
      }
      break;
    }
    case kIsacUpperBand16: {
      for (j = 0, k = 0; k < FRAMESAMPLES; k += 4, j++) {
        val = ((fr[j] + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((fi[j] + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        val = ((fr[(FRAMESAMPLES_HALF) - 1 - j] + ditherQ7[k + 2] + 64) &
            0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum += val * val;

        val = ((fi[(FRAMESAMPLES_HALF) - 1 - j] + ditherQ7[k + 3] + 64) &
            0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[k >> 2] = sum >> 2;
      }
      break;
    }
  }

  /* compute correlation from power spectrum */
  FindCorrelation(PSpec, CorrQ7);

  /* Find AR coefficients */
  /* Aumber of bit shifts to 14-bit normalize CorrQ7[0]
   * (leaving room for sign) */
  shift_var = WebRtcSpl_NormW32(CorrQ7[0]) - 18;

  if (shift_var > 0) {
    for (k = 0; k < AR_ORDER + 1; k++) {
      CorrQ7_norm[k] = CorrQ7[k] << shift_var;
    }
  } else {
    for (k = 0; k < AR_ORDER + 1; k++) {
      CorrQ7_norm[k] = CorrQ7[k] >> (-shift_var);
    }
  }

  /* Find RC coefficients. */
  WebRtcSpl_AutoCorrToReflCoef(CorrQ7_norm, AR_ORDER, RCQ15);

  /* Quantize & code RC Coefficient. */
  WebRtcIsac_EncodeRc(RCQ15, streamdata);

  /* RC -> AR coefficients */
  WebRtcSpl_ReflCoefToLpc(RCQ15, AR_ORDER, ARCoefQ12);

  /* Compute ARCoef' * Corr * ARCoef in Q19. */
  nrg = 0;
  for (j = 0; j <= AR_ORDER; j++) {
    for (n = 0; n <= j; n++) {
      nrg += (ARCoefQ12[j] * ((CorrQ7_norm[j - n] * ARCoefQ12[n] + 256) >> 9) +
          4) >> 3;
    }
    for (n = j + 1; n <= AR_ORDER; n++) {
      nrg += (ARCoefQ12[j] * ((CorrQ7_norm[n - j] * ARCoefQ12[n] + 256) >> 9) +
          4) >> 3;
    }
  }

  nrg_u32 = (uint32_t)nrg;
  if (shift_var > 0) {
    nrg_u32 = nrg_u32 >> shift_var;
  } else {
    nrg_u32 = nrg_u32 << (-shift_var);
  }
  if (nrg_u32 > 0x7FFFFFFF) {
    nrg = 0x7FFFFFFF;
  }  else {
    nrg = (int32_t)nrg_u32;
  }
  /* Also shifts 31 bits to the left! */
  gain2_Q10 = WebRtcSpl_DivResultInQ31(FRAMESAMPLES_QUARTER, nrg);

  /* Quantize & code gain2_Q10. */
  if (WebRtcIsac_EncodeGain2(&gain2_Q10, streamdata)) {
    return -1;
  }

  /* Compute inverse AR power spectrum. */
  FindInvArSpec(ARCoefQ12, gain2_Q10, invARSpec2_Q16);
  /* Convert to magnitude spectrum, by doing square-roots
   * (modified from SPLIB). */
  res = 1 << (WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]) >> 1);
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    in_sqrt = invARSpec2_Q16[k];
    i = 10;
    /* Negative values make no sense for a real sqrt-function. */
    if (in_sqrt < 0) {
      in_sqrt = -in_sqrt;
    }
    newRes = (in_sqrt / res + res) >> 1;
    do {
      res = newRes;
      newRes = (in_sqrt / res + res) >> 1;
    } while (newRes != res && i-- > 0);

    invARSpecQ8[k] = (int16_t)newRes;
  }
  /* arithmetic coding of spectrum */
  err = WebRtcIsac_EncLogisticMulti2(streamdata, dataQ7, invARSpecQ8,
                                     num_dft_coeff, is_12khz);
  if (err < 0) {
    return (err);
  }
  return 0;
}